

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_printer.hpp
# Opt level: O2

StringList * __thiscall
Args::HelpPrinter::createUsageString_abi_cxx11_
          (StringList *__return_storage_ptr__,HelpPrinter *this,ArgIface *arg,bool required)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined3 in_register_00000009;
  String usage;
  value_type local_58;
  string local_38 [32];
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.field_2._M_local_buf[0] = '\0';
  if (CONCAT31(in_register_00000009,required) == 0) {
    std::__cxx11::string::append((char *)&local_58);
  }
  iVar1 = (*arg->_vptr_ArgIface[7])(arg);
  if (*(long *)(CONCAT44(extraout_var,iVar1) + 8) != 0) {
    std::__cxx11::string::append((char *)&local_58);
    (*arg->_vptr_ArgIface[7])(arg);
    std::__cxx11::string::append((string *)&local_58);
    iVar1 = (*arg->_vptr_ArgIface[8])(arg);
    if (*(long *)(CONCAT44(extraout_var_00,iVar1) + 8) != 0) {
      std::__cxx11::string::append((char *)&local_58);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&local_58);
      local_58._M_string_length = 0;
      *local_58._M_dataplus._M_p = '\0';
    }
  }
  iVar1 = (*arg->_vptr_ArgIface[8])(arg);
  if (*(long *)(CONCAT44(extraout_var_01,iVar1) + 8) == 0) {
    iVar1 = (*arg->_vptr_ArgIface[7])(arg);
    if (*(long *)(CONCAT44(extraout_var_02,iVar1) + 8) == 0) {
      iVar1 = (*arg->_vptr_ArgIface[8])(arg);
      if (*(long *)(CONCAT44(extraout_var_03,iVar1) + 8) == 0) {
        (*arg->_vptr_ArgIface[3])(local_38,arg);
        std::__cxx11::string::append((string *)&local_58);
        std::__cxx11::string::~string(local_38);
      }
    }
  }
  else {
    std::__cxx11::string::append((char *)&local_58);
    (*arg->_vptr_ArgIface[8])(arg);
    std::__cxx11::string::append((string *)&local_58);
  }
  iVar1 = (*arg->_vptr_ArgIface[4])(arg);
  if ((char)iVar1 != '\0') {
    std::__cxx11::string::append((char *)&local_58);
    (*arg->_vptr_ArgIface[9])(arg);
    std::__cxx11::string::append((string *)&local_58);
    std::__cxx11::string::append((char *)&local_58);
  }
  if (!required) {
    std::__cxx11::string::append((char *)&local_58);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

inline StringList
HelpPrinter::createUsageString( ArgIface * arg, bool required ) const
{
	StringList result;

	String usage;

	if( !required )
		usage.append( SL( "[ " ) );

	if( !arg->flag().empty() )
	{
		usage.append( SL( "-" ) );
		usage.append( arg->flag() );

		if( !arg->argumentName().empty() )
		{
			usage.append( SL( "," ) );

			result.push_back( usage );

			usage.clear();
		}
	}

	if( !arg->argumentName().empty() )
	{
		usage.append( SL( "--" ) );
		usage.append( arg->argumentName() );
	}
	else if( arg->flag().empty() && arg->argumentName().empty() )
		usage.append( arg->name() );

	if( arg->isWithValue() )
	{
		usage.append( SL( " <" ) );
		usage.append( arg->valueSpecifier() );
		usage.append( SL( ">" ) );
	}

	if( !required )
		usage.append( SL( " ]" ) );

	result.push_back( usage );

	return result;
}